

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileIf(jx9_gen_state *pGen)

{
  ulong uVar1;
  void *pvVar2;
  GenBlock *pGVar3;
  sxu32 sVar4;
  sxi32 sVar5;
  bool bVar6;
  sxi32 rc;
  sxu32 nKeyID;
  sxu32 nJumpIdx;
  GenBlock *pCondBlock;
  SyToken *pEnd;
  SyToken *pTmp;
  SyToken *pToken;
  jx9_gen_state *pGen_local;
  
  pCondBlock = (GenBlock *)0x0;
  _nKeyID = (GenBlock *)0x0;
  pGen->pIn = pGen->pIn + 1;
  pTmp = pGen->pIn;
  pToken = (SyToken *)pGen;
  sVar4 = jx9VmInstrLength(pGen->pVm);
  sVar5 = GenStateEnterBlock(pGen,4,sVar4,(void *)0x0,(GenBlock **)&nKeyID);
  if (sVar5 == 0) {
    while ((pTmp < (SyToken *)pToken[0xb].sData.zString && ((pTmp->nType & 0x200) != 0))) {
      pTmp = pTmp + 1;
      jx9DelimitNestedTokens
                (pTmp,(SyToken *)pToken[0xb].sData.zString,0x200,0x400,(SyToken **)&pCondBlock);
      if ((pCondBlock <= pTmp) || ((pCondBlock->nFirstInstr & 0x400) == 0)) {
        if ((SyToken *)pToken[0xb].sData.zString <= pTmp) {
          pTmp = pTmp + -1;
        }
        sVar5 = jx9GenCompileError((jx9_gen_state *)pToken,1,pTmp->nLine,
                                   "if/else/elseif: Missing \')\'");
        if (sVar5 == -10) {
          return -10;
        }
        goto LAB_001374c4;
      }
      pEnd = (SyToken *)pToken[0xb].sData.zString;
      pToken[10].pUserData = pTmp;
      pToken[0xb].sData.zString = (char *)pCondBlock;
      sVar5 = jx9CompileExpr((jx9_gen_state *)pToken,0,
                             (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      while ((GenBlock *)pToken[10].pUserData < pCondBlock) {
        jx9GenCompileError((jx9_gen_state *)pToken,1,*(sxu32 *)((long)pToken[10].pUserData + 0x14),
                           "Unexpected token \'%z\'",pToken[10].pUserData);
        pToken[10].pUserData = (void *)((long)pToken[10].pUserData + 0x20);
      }
      pToken[10].pUserData = &(pCondBlock->aJumpFix).pBase;
      pToken[0xb].sData.zString = (char *)pEnd;
      if (sVar5 == -10) {
        return -10;
      }
      jx9VmEmitInstr((jx9_vm *)(pToken->sData).zString,9,0,0,(void *)0x0,(sxu32 *)&rc);
      GenStateNewJumpFixup(_nKeyID,9,rc);
      sVar5 = jx9CompileBlock((jx9_gen_state *)pToken);
      if (sVar5 == -10) {
        return -10;
      }
      if (((pToken[0xb].sData.zString <= pToken[10].pUserData) ||
          ((*(uint *)((long)pToken[10].pUserData + 0x10) & 4) == 0)) ||
         (uVar1 = *(ulong *)((long)pToken[10].pUserData + 0x18), (uVar1 & 0xc000000) == 0)) {
LAB_001373eb:
        pGVar3 = _nKeyID;
        sVar4 = jx9VmInstrLength((jx9_vm *)(pToken->sData).zString);
        GenStateFixJumps(pGVar3,9,sVar4);
        if (((pToken[10].pUserData < pToken[0xb].sData.zString) &&
            ((*(uint *)((long)pToken[10].pUserData + 0x10) & 4) != 0)) &&
           ((*(ulong *)((long)pToken[10].pUserData + 0x18) & 0x8000000) != 0)) {
          pToken[10].pUserData = (void *)((long)pToken[10].pUserData + 0x20);
          sVar5 = jx9CompileBlock((jx9_gen_state *)pToken);
          if (sVar5 == -10) {
            return -10;
          }
        }
        rc = jx9VmInstrLength((jx9_vm *)(pToken->sData).zString);
        GenStateFixJumps(_nKeyID,8,rc);
        GenStateLeaveBlock((jx9_gen_state *)pToken,(GenBlock **)0x0);
        return 0;
      }
      jx9VmEmitInstr((jx9_vm *)(pToken->sData).zString,8,0,0,(void *)0x0,(sxu32 *)&rc);
      GenStateNewJumpFixup(_nKeyID,8,rc);
      pGVar3 = _nKeyID;
      if ((uVar1 & 0x8000000) != 0) {
        pvVar2 = pToken[10].pUserData;
        pTmp = (SyToken *)((long)pvVar2 + 0x20);
        if ((((SyToken *)pToken[0xb].sData.zString <= pTmp) ||
            ((*(uint *)((long)pvVar2 + 0x30) & 4) == 0)) ||
           ((int)*(undefined8 *)((long)pvVar2 + 0x38) != 3)) goto LAB_001373eb;
        pToken[10].pUserData = (void *)((long)pToken[10].pUserData + 0x20);
      }
      pToken[10].pUserData = (void *)((long)pToken[10].pUserData + 0x20);
      pTmp = (SyToken *)pToken[10].pUserData;
      sVar4 = jx9VmInstrLength((jx9_vm *)(pToken->sData).zString);
      GenStateFixJumps(pGVar3,9,sVar4);
    }
    if ((SyToken *)pToken[0xb].sData.zString <= pTmp) {
      pTmp = pTmp + -1;
    }
    sVar5 = jx9GenCompileError((jx9_gen_state *)pToken,1,pTmp->nLine,"if/else/elseif: Missing \'(\'"
                              );
    if (sVar5 == -10) {
      pGen_local._4_4_ = -10;
    }
    else {
LAB_001374c4:
      while( true ) {
        bVar6 = false;
        if (pToken[10].pUserData < pToken[0xb].sData.zString) {
          bVar6 = (*(uint *)((long)pToken[10].pUserData + 0x10) & 0x40040) == 0;
        }
        if (!bVar6) break;
        pToken[10].pUserData = (void *)((long)pToken[10].pUserData + 0x20);
      }
      pGen_local._4_4_ = 0;
    }
  }
  else {
    pGen_local._4_4_ = -10;
  }
  return pGen_local._4_4_;
}

Assistant:

static sxi32 jx9CompileIf(jx9_gen_state *pGen)
{
	SyToken *pToken, *pTmp, *pEnd = 0;
	GenBlock *pCondBlock = 0;
	sxu32 nJumpIdx;
	sxu32 nKeyID;
	sxi32 rc;
	/* Jump the 'if' keyword */
	pGen->pIn++;
	pToken = pGen->pIn; 
	/* Create the conditional block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_COND, jx9VmInstrLength(pGen->pVm), 0, &pCondBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Process as many [if/else if/elseif/else] blocks as we can */
	for(;;){
		if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_LPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing '('");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Jump the left parenthesis '(' */
		pToken++; 
		/* Delimit the condition */
		jx9DelimitNestedTokens(pToken, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
		if( pToken >= pEnd || (pEnd->nType & JX9_TK_RPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing ')'");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Swap token streams */
		SWAP_TOKEN_STREAM(pGen, pToken, pEnd);
		/* Compile the condition */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		/* Update token stream */
		while(pGen->pIn < pEnd ){
			jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
			pGen->pIn++;
		}
		pGen->pIn  = &pEnd[1];
		pGen->pEnd = pTmp;
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JZ, nJumpIdx);
		/* Compile the body */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			break;
		}
		/* Ensure that the keyword ID is 'else if' or 'else' */
		nKeyID = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( (nKeyID & (JX9_TKWRD_ELSE|JX9_TKWRD_ELIF)) == 0 ){
			break;
		}
		/* Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JMP, nJumpIdx);
		if( nKeyID & JX9_TKWRD_ELSE ){
			pToken = &pGen->pIn[1];
			if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_KEYWORD) == 0 ||
				SX_PTR_TO_INT(pToken->pUserData) != JX9_TKWRD_IF ){
					break;
			}
			pGen->pIn++; /* Jump the 'else' keyword */
		}
		pGen->pIn++; /* Jump the 'elseif/if' keyword */
		/* Synchronize cursors */
		pToken = pGen->pIn;
		/* Fix the false jump */
		GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	} /* For(;;) */
	/* Fix the false jump */
	GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_KEYWORD) &&
		(SX_PTR_TO_INT(pGen->pIn->pUserData) & JX9_TKWRD_ELSE) ){
			/* Compile the else block */
			pGen->pIn++;
			rc = jx9CompileBlock(&(*pGen));
			if( rc == SXERR_ABORT ){
				
				return SXERR_ABORT;
			}
	}
	nJumpIdx = jx9VmInstrLength(pGen->pVm);
	/* Fix all unconditional jumps now the destination is resolved */
	GenStateFixJumps(pCondBlock, JX9_OP_JMP, nJumpIdx);
	/* Release the conditional block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}